

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * __thiscall ghc::filesystem::path::stem(path *__return_storage_ptr__,path *this)

{
  bool bVar1;
  string_type *psVar2;
  string_type local_90;
  long local_70;
  size_type pos;
  path local_58;
  undefined1 local_38 [8];
  impl_string_type fn;
  path *this_local;
  
  fn.field_2._8_8_ = this;
  filename(&local_58,this);
  psVar2 = native_abi_cxx11_(&local_58);
  std::__cxx11::string::string((string *)local_38,(string *)psVar2);
  ~path(&local_58);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38,".");
  if ((((bVar1) &&
       (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_38,".."), bVar1)) &&
      (local_70 = std::__cxx11::string::rfind((char)local_38,0x2e), local_70 != -1)) &&
     (local_70 != 0)) {
    std::__cxx11::string::substr((ulong)&local_90,(ulong)local_38);
    path(__return_storage_ptr__,&local_90,native_format);
    std::__cxx11::string::~string((string *)&local_90);
  }
  else {
    path<std::__cxx11::string,ghc::filesystem::path>
              (__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
               native_format);
  }
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::stem() const
{
    impl_string_type fn = filename().native();
    if (fn != "." && fn != "..") {
        impl_string_type::size_type pos = fn.rfind('.');
        if (pos != impl_string_type::npos && pos > 0) {
            return path{fn.substr(0, pos), native_format};
        }
    }
    return path{fn, native_format};
}